

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> __thiscall
cmGraphVizWriter::CreateTargetFile(cmGraphVizWriter *this,cmLinkItem *item,string *fileNameSuffix)

{
  string *psVar1;
  cmGeneratedFileStream *this_00;
  undefined8 *in_RCX;
  pointer *__ptr;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string perTargetFileName;
  string pathSafeItemName;
  string local_d8;
  string local_b8;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  undefined1 *local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  psVar1 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)fileNameSuffix);
  PathSafeString(&local_b8,psVar1);
  local_68._M_str = *(char **)&item[1].Cross;
  local_68._M_len =
       (size_t)item[1].Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  local_90 = local_88;
  local_98 = 1;
  local_88[0] = 0x2e;
  local_58 = 1;
  local_48 = local_b8._M_string_length;
  local_40 = local_b8._M_dataplus._M_p;
  local_30 = *in_RCX;
  local_38 = in_RCX[1];
  views._M_len = 4;
  views._M_array = &local_68;
  local_50 = local_90;
  cmCatViews_abi_cxx11_(&local_d8,views);
  this_00 = (cmGeneratedFileStream *)operator_new(0x268);
  cmGeneratedFileStream::cmGeneratedFileStream(this_00,&local_d8,false,None);
  (this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor = (_func_int **)this_00;
  psVar1 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)fileNameSuffix);
  WriteHeader((cmGraphVizWriter *)item,this_00,psVar1);
  WriteNode((cmGraphVizWriter *)item,this_00,(cmLinkItem *)fileNameSuffix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
          )(__uniq_ptr_data<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmGeneratedFileStream> cmGraphVizWriter::CreateTargetFile(
  cmLinkItem const& item, std::string const& fileNameSuffix)
{
  auto const pathSafeItemName = PathSafeString(item.AsStr());
  auto const perTargetFileName =
    cmStrCat(this->FileName, '.', pathSafeItemName, fileNameSuffix);
  auto perTargetFileStream =
    cm::make_unique<cmGeneratedFileStream>(perTargetFileName);

  this->WriteHeader(*perTargetFileStream, item.AsStr());
  this->WriteNode(*perTargetFileStream, item);

  return perTargetFileStream;
}